

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.h
# Opt level: O0

void __thiscall SGParser::Generator::NFA::NFA(NFA *this,uint c,uint lexemeId)

{
  uint lexemeId_local;
  uint c_local;
  NFA *this_local;
  
  this->LexemeId = 0xffffffff;
  this->pStartState = (NFANode *)0x0;
  std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
  vector(&this->FinalState);
  Create(this,c,lexemeId);
  return;
}

Assistant:

NFA(unsigned c, unsigned lexemeId) {
        Create(c, lexemeId);
    }